

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  pointer ppcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  cmValue cVar5;
  PolicyID id;
  char *__s;
  string_view arg;
  string_view separator;
  string ndefs;
  char *define;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defs;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  string local_80;
  string local_60;
  char *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar4 != 0)) {
    ParseDefineFlag::valid.regmust = (char *)0x0;
    ParseDefineFlag::valid.program = (char *)0x0;
    ParseDefineFlag::valid.progsize = 0;
    memset(&ParseDefineFlag::valid,0,0xaa);
    cmsys::RegularExpression::compile(&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$")
    ;
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  bVar2 = cmsys::RegularExpression::find
                    (&ParseDefineFlag::valid,(def->_M_dataplus)._M_p,
                     &ParseDefineFlag::valid.regmatch);
  if (bVar2) {
    if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
       (iVar4 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
       iVar4 != 0)) {
      ParseDefineFlag::trivial.regmust = (char *)0x0;
      ParseDefineFlag::trivial.program = (char *)0x0;
      ParseDefineFlag::trivial.progsize = 0;
      memset(&ParseDefineFlag::trivial,0,0xaa);
      cmsys::RegularExpression::compile
                (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                   &__dso_handle);
      __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
    }
    bVar2 = cmsys::RegularExpression::find
                      (&ParseDefineFlag::trivial,(def->_M_dataplus)._M_p,
                       &ParseDefineFlag::trivial.regmatch);
    if (bVar2) {
LAB_002983db:
      __s = (def->_M_dataplus)._M_p + 2;
      local_40 = __s;
      if (remove) {
        local_a8._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"COMPILE_DEFINITIONS","")
        ;
        cVar5 = GetProperty(this,(string *)local_a8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98) {
          operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
        }
        if (cVar5.Value != (string *)0x0) {
          arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
          arg._M_len = (cVar5.Value)->_M_string_length;
          cmExpandedList_abi_cxx11_(&local_38,arg,false);
          local_a8._8_8_ =
               std::
               __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                         ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_38.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_38.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_equals_val<const_char_*const>)&local_40);
          local_a8._0_8_ =
               local_38.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    (&local_60,
                     (cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_a8,separator);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_98 + 0x18),"COMPILE_DEFINITIONS","");
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a8,&this->StateSnapshot);
          cmStateDirectory::SetProperty
                    ((cmStateDirectory *)local_a8,(string *)(local_98 + 0x18),&local_60,
                     &this->Backtrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_38);
        }
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"COMPILE_DEFINITIONS","");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_98 + 0x18),__s,(allocator<char> *)&local_38);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a8,&this->StateSnapshot);
        cmStateDirectory::AppendProperty
                  ((cmStateDirectory *)local_a8,&local_60,(string *)(local_98 + 0x18),false,
                   &this->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      return true;
    }
    PVar3 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0005,false);
    if (PVar3 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_a8,(cmPolicies *)0x5,id);
      ppcVar1 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->ExecutionStatusStack).
          super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar1) {
        ppcVar1[-1]->NestedError = true;
      }
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_a8,
                          &this->Backtrace);
    }
    else {
      if (PVar3 == OLD) {
        return false;
      }
      if (PVar3 != WARN) goto LAB_002983db;
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_a8,(cmPolicies *)0x5,id);
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,(string *)local_a8,
                          &this->Backtrace);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
    }
  }
  return false;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if (!valid.find(def)) {
    return false;
  }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression trivial(
    "^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if (!trivial.find(def)) {
    // This definition has a non-trivial value.
    switch (this->GetPolicyStatus(cmPolicies::CMP0005)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0005));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005));
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
    }
  }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if (remove) {
    if (cmValue cdefs = this->GetProperty("COMPILE_DEFINITIONS")) {
      // Expand the list.
      std::vector<std::string> defs = cmExpandedList(*cdefs);

      // Recompose the list without the definition.
      auto defEnd = std::remove(defs.begin(), defs.end(), define);
      auto defBegin = defs.begin();
      std::string ndefs = cmJoin(cmMakeRange(defBegin, defEnd), ";");

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", ndefs);
    }
  } else {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
  }

  return true;
}